

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O2

bool check_sa_eqdss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
               (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *sa,string *str,comm *c)

{
  pointer puVar1;
  unsigned_long *puVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  long lVar3;
  bool bVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> true_sa;
  vector<unsigned_long,_std::allocator<unsigned_long>_> gsa;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,&sa->local_SA,0,c);
  bVar4 = true;
  if (c->m_rank == 0) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    begin._M_current = (str->_M_dataplus)._M_p;
    dss::construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long>
              (begin,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(begin._M_current + str->_M_string_length),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
    if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48._M_impl.super__Vector_impl_data._M_start ==
        (long)local_30._M_impl.super__Vector_impl_data._M_finish -
        (long)local_30._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      do {
        bVar4 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3 == lVar3;
        if (bVar4) break;
        puVar1 = local_48._M_impl.super__Vector_impl_data._M_start + lVar3;
        puVar2 = local_30._M_impl.super__Vector_impl_data._M_start + lVar3;
        lVar3 = lVar3 + 1;
      } while (*puVar1 == *puVar2);
    }
    else {
      bVar4 = false;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  }
  bVar4 = mxx::all_of(bVar4,c);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
  return bVar4;
}

Assistant:

bool check_sa_eqdss(suffix_array<Iterator, index_t, _LCP>& sa, const std::string& str, const mxx::comm& c) {
    // gather SA back to root process
    std::vector<index_t> gsa = mxx::gatherv(sa.local_SA, 0, c);

    // check correctness using dss
    bool dss_correct = true;
    if (c.rank() == 0) {
        std::vector<index_t> true_sa;
        dss::construct(str.begin(), str.end(), true_sa);
        if (true_sa.size() != gsa.size()) {
            dss_correct = false;
        } else {
            for (size_t i = 0; i < true_sa.size(); ++i) {
                if (true_sa[i] != gsa[i]) {
                    dss_correct = false;
                    break;
                }
            }
        }
    }
    return mxx::all_of(dss_correct, c);
}